

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlsio_openssl.c
# Opt level: O0

void on_underlying_io_bytes_received(void *context,uchar *buffer,size_t size)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  long lVar3;
  uchar *local_a8;
  long local_a0;
  ulong local_98;
  size_t length_remaining;
  LOGGER_LOG l_6;
  LOGGER_LOG l_5;
  char *pcStack_68;
  int status_code;
  char *request_end_ptr;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  uchar *new_receive_buffer;
  size_t realloc_size;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  HTTP_PROXY_IO_INSTANCE *http_proxy_io_instance;
  LOGGER_LOG l;
  size_t size_local;
  uchar *buffer_local;
  void *context_local;
  
  l = (LOGGER_LOG)size;
  size_local = (size_t)buffer;
  buffer_local = (uchar *)context;
  if (context == (void *)0x0) {
    http_proxy_io_instance = (HTTP_PROXY_IO_INSTANCE *)xlogging_get_log_function();
    if (http_proxy_io_instance != (HTTP_PROXY_IO_INSTANCE *)0x0) {
      (*(code *)http_proxy_io_instance)
                (0,
                 "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/src/http_proxy_io.c"
                 ,"on_underlying_io_bytes_received",0x269,1,
                 "NULL context in on_underlying_io_bytes_received");
    }
  }
  else {
    l_1 = (LOGGER_LOG)context;
    switch(*context) {
    case 1:
      realloc_size = (size_t)xlogging_get_log_function();
      if ((LOGGER_LOG)realloc_size != (LOGGER_LOG)0x0) {
        (*(code *)realloc_size)
                  (AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/src/http_proxy_io.c"
                   ,"on_underlying_io_bytes_received",0x278,1,
                   "Bytes received while opening underlying IO");
      }
      indicate_open_complete_error_and_close((HTTP_PROXY_IO_INSTANCE *)l_1);
      break;
    case 2:
      if (*(ulong *)((long)context + 0x88) < -size - 1) {
        local_98 = *(long *)((long)context + 0x88) + size;
      }
      else {
        local_98 = 0xffffffffffffffff;
      }
      if (local_98 < 0xfffffffffffffffe) {
        if (*(ulong *)((long)context + 0x88) < -size - 1) {
          local_a0 = *(long *)((long)context + 0x88) + size;
        }
        else {
          local_a0 = -1;
        }
        local_a8 = (uchar *)(local_a0 + 1);
      }
      else {
        local_a8 = (uchar *)0xffffffffffffffff;
      }
      new_receive_buffer = local_a8;
      l_3 = (LOGGER_LOG)0x0;
      if (local_a8 == (uchar *)0xffffffffffffffff) {
        l_4 = xlogging_get_log_function();
        if (l_4 != (LOGGER_LOG)0x0) {
          (*l_4)(AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/src/http_proxy_io.c"
                 ,"on_underlying_io_bytes_received",0x285,1,"Invalid memory size for received data")
          ;
        }
        indicate_open_complete_error_and_close((HTTP_PROXY_IO_INSTANCE *)l_1);
      }
      else {
        l_3 = (LOGGER_LOG)realloc(*(void **)((long)context + 0x80),(size_t)local_a8);
        if (l_3 == (LOGGER_LOG)0x0) {
          request_end_ptr = (char *)xlogging_get_log_function();
          if ((LOGGER_LOG)request_end_ptr != (LOGGER_LOG)0x0) {
            (*(code *)request_end_ptr)
                      (AZ_LOG_ERROR,
                       "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/src/http_proxy_io.c"
                       ,"on_underlying_io_bytes_received",0x28b,1,
                       "Cannot allocate memory for received data");
          }
          indicate_open_complete_error_and_close((HTTP_PROXY_IO_INSTANCE *)l_1);
        }
        else {
          *(LOGGER_LOG *)(l_1 + 0x80) = l_3;
          memcpy((void *)(*(long *)(l_1 + 0x80) + *(long *)(l_1 + 0x88)),(void *)size_local,
                 (size_t)l);
          *(LOGGER_LOG *)(l_1 + 0x88) = l + *(long *)(l_1 + 0x88);
        }
      }
      if (((3 < *(ulong *)(l_1 + 0x88)) &&
          (*(undefined1 *)(*(long *)(l_1 + 0x80) + *(long *)(l_1 + 0x88)) = 0,
          3 < *(ulong *)(l_1 + 0x88))) &&
         (pcStack_68 = strstr(*(char **)(l_1 + 0x80),"\r\n\r\n"), pcStack_68 != (char *)0x0)) {
        iVar1 = ParseHttpResponse(*(char **)(l_1 + 0x80),(int *)((long)&l_5 + 4));
        if (iVar1 == 0) {
          if ((l_5._4_4_ < 200) || (299 < l_5._4_4_)) {
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 != (LOGGER_LOG)0x0) {
              (*p_Var2)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/src/http_proxy_io.c"
                        ,"on_underlying_io_bytes_received",0x2b4,1,
                        "Bad status (%d) received in CONNECT response",l_5._4_4_);
            }
            indicate_open_complete_error_and_close((HTTP_PROXY_IO_INSTANCE *)l_1);
          }
          else {
            lVar3 = (*(long *)(l_1 + 0x80) + *(long *)(l_1 + 0x88)) - (long)(pcStack_68 + 4);
            *(undefined4 *)l_1 = 3;
            (**(code **)(l_1 + 0x28))(*(undefined8 *)(l_1 + 0x30),1);
            if (lVar3 != 0) {
              (**(code **)(l_1 + 8))(*(undefined8 *)(l_1 + 0x10),pcStack_68 + 4,lVar3);
            }
          }
        }
        else {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/src/http_proxy_io.c"
                      ,"on_underlying_io_bytes_received",0x2ac,1,"Cannot decode HTTP response");
          }
          indicate_open_complete_error_and_close((HTTP_PROXY_IO_INSTANCE *)l_1);
        }
      }
      break;
    case 3:
      (**(code **)((long)context + 8))(*(undefined8 *)((long)context + 0x10),buffer,size);
      break;
    default:
      l_2 = xlogging_get_log_function();
      if (l_2 != (LOGGER_LOG)0x0) {
        (*l_2)(AZ_LOG_ERROR,
               "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/src/http_proxy_io.c"
               ,"on_underlying_io_bytes_received",0x273,1,"Bytes received in invalid state");
      }
    }
  }
  return;
}

Assistant:

static void on_underlying_io_bytes_received(void* context, const unsigned char* buffer, size_t size)
{
    TLS_IO_INSTANCE* tls_io_instance = (TLS_IO_INSTANCE*)context;

    int written = BIO_write(tls_io_instance->in_bio, buffer, (int)size);
    if (written != (int)size)
    {
        tls_io_instance->tlsio_state = TLSIO_STATE_ERROR;
        indicate_error(tls_io_instance);
        log_ERR_get_error("Error in BIO_write.");
    }
    else
    {
        switch (tls_io_instance->tlsio_state)
        {
        default:
            break;

        case TLSIO_STATE_IN_HANDSHAKE:
            send_handshake_bytes(tls_io_instance);
            break;

        case TLSIO_STATE_OPEN:
            if (decode_ssl_received_bytes(tls_io_instance) != 0)
            {
                tls_io_instance->tlsio_state = TLSIO_STATE_ERROR;
                indicate_error(tls_io_instance);
                LogError("Error in decode_ssl_received_bytes.");
            }
            break;
        }
    }
}